

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

int rtr_mgr_setup_sockets
              (rtr_mgr_config *config,rtr_mgr_group *groups,uint groups_len,uint refresh_interval,
              uint expire_interval,uint retry_interval)

{
  undefined8 *puVar1;
  long lVar2;
  tommy_node_struct *ptVar3;
  int iVar4;
  tommy_list_wrapper *ptVar5;
  tommy_node_struct *group;
  tommy_node *node;
  rtr_interval_mode iv_mode;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  config->len = groups_len;
  iv_mode = retry_interval;
  ptVar5 = (tommy_list_wrapper *)lrtr_malloc(8);
  config->groups = ptVar5;
  iVar4 = -1;
  if (ptVar5 != (tommy_list_wrapper *)0x0) {
    ptVar5->list = (tommy_list)0x0;
    for (lVar6 = 0; (ulong)groups_len * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      group = (tommy_node_struct *)lrtr_malloc(0x18);
      if (group == (tommy_node_struct *)0x0) {
LAB_00105a4c:
        iVar4 = -1;
        goto LAB_00105a63;
      }
      group->data = *(void **)((long)&groups->status + lVar6);
      puVar1 = (undefined8 *)((long)&groups->sockets + lVar6);
      ptVar3 = (tommy_node_struct *)puVar1[1];
      group->next = (tommy_node_struct *)*puVar1;
      group->prev = ptVar3;
      *(rtr_mgr_status *)&group->data = RTR_MGR_CLOSED;
      iVar4 = rtr_mgr_init_sockets
                        ((rtr_mgr_group *)group,config,refresh_interval,expire_interval,
                         retry_interval,iv_mode);
      if (iVar4 != 0) {
LAB_00105a44:
        lrtr_free(group);
        goto LAB_00105a4c;
      }
      node = (tommy_node *)lrtr_malloc(0x28);
      if (node == (tommy_node *)0x0) goto LAB_00105a44;
      node[1].next = group;
      tommy_list_insert_tail(&config->groups->list,node,node);
    }
    tommy_list_sort(&config->groups->list,rtr_mgr_config_cmp_tommy);
    iVar4 = 0;
  }
LAB_00105a63:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_setup_sockets(struct rtr_mgr_config *config, struct rtr_mgr_group groups[],
					const unsigned int groups_len, const unsigned int refresh_interval,
					const unsigned int expire_interval, const unsigned int retry_interval)
{
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	struct rtr_mgr_group_node *group_node = NULL;
	struct rtr_mgr_group *cg = NULL;
	/* Copy the groups from the array into linked list config->groups */
	config->len = groups_len;
	config->groups = lrtr_malloc(sizeof(*config->groups));
	if (!config->groups) {
		return RTR_ERROR;
	}

	config->groups->list = NULL;

	for (unsigned int i = 0; i < groups_len; i++) {
		cg = lrtr_malloc(sizeof(struct rtr_mgr_group));
		if (!cg) {
			return RTR_ERROR;
		}

		memcpy(cg, &groups[i], sizeof(struct rtr_mgr_group));

		cg->status = RTR_MGR_CLOSED;
		if (rtr_mgr_init_sockets(cg, config, refresh_interval, expire_interval, retry_interval, iv_mode)) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
		if (!group_node) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node->group = cg;
		tommy_list_insert_tail(&config->groups->list, &group_node->node, group_node);
	}
	/* Our linked list should be sorted already, since the groups array was
	 * sorted. However, for safety reasons we sort again.
	 */
	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	return RTR_SUCCESS;
}